

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
cimod::BinaryPolynomialModel<int,_double>::GenerateChangedKey
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          BinaryPolynomialModel<int,_double> *this,vector<int,_std::allocator<int>_> *original_key,
          size_t num_of_key)

{
  pointer piVar1;
  pointer piVar2;
  iterator __position;
  runtime_error *this_00;
  int *__args;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bitset<65535UL> bs;
  size_t local_2030 [1024];
  
  piVar1 = (original_key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (original_key->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)piVar2 - (long)piVar1 >> 2;
  if (uVar4 < 0xffff) {
    memset(local_2030,0,0x2000);
    local_2030[0] = num_of_key;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar2 != piVar1) {
      lVar5 = 0;
      uVar3 = 0;
      do {
        if ((local_2030[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
          __args = (int *)((long)(original_key->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar5);
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 4;
      } while (uVar4 + (uVar4 == 0) != uVar3);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Too large degree of the interaction");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<IndexType>
    GenerateChangedKey( const std::vector<IndexType> &original_key, const std::size_t num_of_key ) const {
      if ( original_key.size() >= UINT16_MAX ) {
        throw std::runtime_error( "Too large degree of the interaction" );
      }
      const std::size_t original_key_size = original_key.size();
      std::bitset<UINT16_MAX> bs( num_of_key );
      std::vector<IndexType> changed_key;
      for ( std::size_t i = 0; i < original_key_size; ++i ) {
        if ( bs[ i ] ) {
          changed_key.push_back( original_key[ i ] );
        }
      }
      return changed_key;
    }